

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex.h
# Opt level: O0

void __thiscall
alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::
correct_traversal_path
          (Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *this,
          data_node_type *leaf,
          vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode>_>
          *traversal_path,bool left)

{
  byte bVar1;
  int iVar2;
  reference pvVar3;
  reference pvVar4;
  byte in_CL;
  long in_RSI;
  model_node_type *node_1;
  AlexNode<int,_int> *cur_1;
  int correct_bucketID_1;
  int end_bucketID;
  model_node_type *parent_1;
  TraversalNode *tn_1;
  int repeats_1;
  model_node_type *node;
  AlexNode<int,_int> *cur;
  int correct_bucketID;
  int start_bucketID;
  model_node_type *parent;
  TraversalNode *tn;
  int repeats;
  int in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  int iVar5;
  int in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  AlexNode<int,_int> *local_80;
  int local_74;
  model_node_type *local_70;
  AlexNode<int,_int> *local_40;
  int local_34;
  model_node_type *local_30;
  
  if ((in_CL & 1) == 0) {
    local_74 = 1 << (*(byte *)(in_RSI + 9) & 0x1f);
    pvVar3 = std::
             vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode>_>
             ::back((vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode>_>
                     *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    local_70 = pvVar3->node;
    iVar5 = pvVar3->bucketID;
    local_74 = (iVar5 - pvVar3->bucketID % local_74) + local_74;
    if (local_74 == local_70->num_children_) {
      for (; local_74 == local_70->num_children_;
          local_74 = (in_stack_ffffffffffffff58 - pvVar3->bucketID % local_74) + local_74) {
        std::
        vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode>_>
        ::pop_back((vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode>_>
                    *)0x173eb5);
        local_74 = 1 << ((local_70->super_AlexNode<int,_int>).duplication_factor_ & 0x1f);
        pvVar4 = std::
                 vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode>_>
                 ::back((vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode>_>
                         *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
        pvVar3->node = pvVar4->node;
        pvVar3->bucketID = pvVar4->bucketID;
        local_70 = pvVar3->node;
        in_stack_ffffffffffffff58 = pvVar3->bucketID;
      }
      pvVar3->bucketID = local_74;
      local_80 = local_70->children_[local_74];
      while (((local_80->is_leaf_ ^ 0xffU) & 1) != 0) {
        std::
        vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode>_>
        ::push_back((vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode>_>
                     *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                    (value_type *)CONCAT44(iVar5,in_stack_ffffffffffffff58));
        local_80 = *(AlexNode<int,_int> **)local_80[1].model_.a_;
      }
      if (local_80 != *(AlexNode<int,_int> **)(in_RSI + 0x38)) {
        __assert_fail("cur == leaf->next_leaf_",
                      "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/core/alex.h"
                      ,0x217,
                      "void alex::Alex<int, int, alex::AlexCompare, std::allocator<std::pair<int, int>>, false>::correct_traversal_path(data_node_type *, std::vector<TraversalNode> &, bool) const [T = int, P = int, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<int, int>>, allow_duplicates = false]"
                     );
      }
    }
    else {
      pvVar3->bucketID = local_74;
    }
  }
  else {
    bVar1 = *(byte *)(in_RSI + 9);
    pvVar3 = std::
             vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode>_>
             ::back((vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode>_>
                     *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    local_30 = pvVar3->node;
    iVar5 = pvVar3->bucketID;
    iVar2 = iVar5 - pvVar3->bucketID % (1 << (bVar1 & 0x1f));
    if (iVar2 == 0) {
      local_34 = 0;
      while (local_34 == 0) {
        std::
        vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode>_>
        ::pop_back((vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode>_>
                    *)0x173cc8);
        bVar1 = (local_30->super_AlexNode<int,_int>).duplication_factor_;
        pvVar4 = std::
                 vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode>_>
                 ::back((vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode>_>
                         *)CONCAT44(iVar5,in_stack_ffffffffffffff60));
        pvVar3->node = pvVar4->node;
        pvVar3->bucketID = pvVar4->bucketID;
        local_30 = pvVar3->node;
        in_stack_ffffffffffffff60 = pvVar3->bucketID;
        local_34 = in_stack_ffffffffffffff60 - pvVar3->bucketID % (1 << (bVar1 & 0x1f));
      }
      pvVar3->bucketID = local_34 + -1;
      local_40 = local_30->children_[local_34 + -1];
      while (((local_40->is_leaf_ ^ 0xffU) & 1) != 0) {
        std::
        vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode>_>
        ::push_back((vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode>_>
                     *)CONCAT44(iVar5,in_stack_ffffffffffffff60),
                    (value_type *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
        local_40 = *(AlexNode<int,_int> **)
                    ((long)local_40[1].model_.a_ + (long)(*(int *)&local_40[1].is_leaf_ + -1) * 8);
      }
      if (local_40 != *(AlexNode<int,_int> **)(in_RSI + 0x40)) {
        __assert_fail("cur == leaf->prev_leaf_",
                      "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/core/alex.h"
                      ,0x1fc,
                      "void alex::Alex<int, int, alex::AlexCompare, std::allocator<std::pair<int, int>>, false>::correct_traversal_path(data_node_type *, std::vector<TraversalNode> &, bool) const [T = int, P = int, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<int, int>>, allow_duplicates = false]"
                     );
      }
    }
    else {
      pvVar3->bucketID = iVar2 + -1;
    }
  }
  return;
}

Assistant:

inline void correct_traversal_path(data_node_type* leaf,
                                     std::vector<TraversalNode>& traversal_path,
                                     bool left) const {
    if (left) {
      int repeats = 1 << leaf->duplication_factor_;
      TraversalNode& tn = traversal_path.back();
      model_node_type* parent = tn.node;
      // First bucket whose pointer is to leaf
      int start_bucketID = tn.bucketID - (tn.bucketID % repeats);
      if (start_bucketID == 0) {
        // Traverse back up the traversal path to make correction
        while (start_bucketID == 0) {
          traversal_path.pop_back();
          repeats = 1 << parent->duplication_factor_;
          tn = traversal_path.back();
          parent = tn.node;
          start_bucketID = tn.bucketID - (tn.bucketID % repeats);
        }
        int correct_bucketID = start_bucketID - 1;
        tn.bucketID = correct_bucketID;
        AlexNode<T, P>* cur = parent->children_[correct_bucketID];
        while (!cur->is_leaf_) {
          auto node = static_cast<model_node_type*>(cur);
          traversal_path.push_back({node, node->num_children_ - 1});
          cur = node->children_[node->num_children_ - 1];
        }
        assert(cur == leaf->prev_leaf_);
      } else {
        tn.bucketID = start_bucketID - 1;
      }
    } else {
      int repeats = 1 << leaf->duplication_factor_;
      TraversalNode& tn = traversal_path.back();
      model_node_type* parent = tn.node;
      // First bucket whose pointer is not to leaf
      int end_bucketID = tn.bucketID - (tn.bucketID % repeats) + repeats;
      if (end_bucketID == parent->num_children_) {
        // Traverse back up the traversal path to make correction
        while (end_bucketID == parent->num_children_) {
          traversal_path.pop_back();
          repeats = 1 << parent->duplication_factor_;
          tn = traversal_path.back();
          parent = tn.node;
          end_bucketID = tn.bucketID - (tn.bucketID % repeats) + repeats;
        }
        int correct_bucketID = end_bucketID;
        tn.bucketID = correct_bucketID;
        AlexNode<T, P>* cur = parent->children_[correct_bucketID];
        while (!cur->is_leaf_) {
          auto node = static_cast<model_node_type*>(cur);
          traversal_path.push_back({node, 0});
          cur = node->children_[0];
        }
        assert(cur == leaf->next_leaf_);
      } else {
        tn.bucketID = end_bucketID;
      }
    }
  }